

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

double __thiscall wasm::Literal::ceil(Literal *this,double __x)

{
  BasicType BVar1;
  Literal *in_RSI;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  double dVar3;
  uintptr_t uStack_20;
  
  BVar1 = wasm::Type::getBasic(&in_RSI->type);
  if (BVar1 == f64) {
    dVar3 = getf64(in_RSI);
    dVar3 = ::ceil(dVar3);
    (this->field_0).i64 = (int64_t)dVar3;
    uStack_20 = 5;
  }
  else {
    if (BVar1 != f32) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x378);
    }
    fVar2 = getf32(in_RSI);
    fVar2 = ceilf(fVar2);
    dVar3 = (double)CONCAT44(extraout_XMM0_Db,fVar2);
    (this->field_0).i32 = (int32_t)fVar2;
    uStack_20 = 4;
  }
  (this->type).id = uStack_20;
  return dVar3;
}

Assistant:

Literal Literal::ceil() const {
  switch (type.getBasic()) {
    case Type::f32:
      return Literal(std::ceil(getf32()));
    case Type::f64:
      return Literal(std::ceil(getf64()));
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}